

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::initializePath(XMLUri *this,XMLCh *uriSpec)

{
  XMLCh *pXVar1;
  bool bVar2;
  int iVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MalformedURLException *pMVar5;
  XMLCh XVar6;
  XMLSize_t XVar7;
  ulong endIndex;
  XMLSize_t endIndex_00;
  ulong startIndex;
  XMLCh value1 [2];
  
  if (uriSpec == (XMLCh *)0x0) {
    pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x341,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
LAB_00269cde:
    __cxa_throw(pMVar5,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  XVar4 = XMLString::stringLen(uriSpec);
  if (XVar4 == 0) {
    XVar6 = L'\0';
    endIndex_00 = 0;
  }
  else if ((this->fScheme == (XMLCh *)0x0) || (*uriSpec == L'/')) {
    XVar6 = L'\0';
    for (XVar7 = 0; endIndex_00 = XVar4, XVar4 != XVar7; XVar7 = XVar7 + 1) {
      XVar6 = uriSpec[XVar7];
      if (XVar6 == L'%') {
        if (XVar4 <= XVar7 + 2) {
          value1[1] = L'\0';
          memcpy(value1,uriSpec + XVar7,(ulong)(XVar7 + 1 < XVar4) * 2 + 2);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x367,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
        bVar2 = XMLString::isHex(uriSpec[XVar7 + 1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[XVar7 + 2]), !bVar2)) {
          value1[0] = (XMLCh)*(undefined4 *)(uriSpec + XVar7);
          value1[1] = (XMLCh)((uint)*(undefined4 *)(uriSpec + XVar7) >> 0x10);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x372,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
      else {
        endIndex_00 = XVar7;
        if ((XVar6 == L'#') || (XVar6 == L'?')) break;
        bVar2 = isUnreservedCharacter(XVar6);
        if ((!bVar2) && (bVar2 = isPathCharacter(XVar6), !bVar2)) {
          value1[1] = L'\0';
          value1[0] = XVar6;
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x37f,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
    }
  }
  else {
    XVar6 = L'\0';
    for (XVar7 = 0; endIndex_00 = XVar4, XVar4 != XVar7; XVar7 = XVar7 + 1) {
      XVar6 = uriSpec[XVar7];
      if (XVar6 == L'%') {
        if (XVar4 <= XVar7 + 2) {
          value1[1] = L'\0';
          memcpy(value1,uriSpec + XVar7,(ulong)(XVar7 + 1 < XVar4) * 2 + 2);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x39e,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
        bVar2 = XMLString::isHex(uriSpec[XVar7 + 1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[XVar7 + 2]), !bVar2)) {
          value1[0] = (XMLCh)*(undefined4 *)(uriSpec + XVar7);
          value1[1] = (XMLCh)((uint)*(undefined4 *)(uriSpec + XVar7) >> 0x10);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3a9,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
      else {
        endIndex_00 = XVar7;
        if ((XVar6 == L'#') || (XVar6 == L'?')) break;
        bVar2 = isReservedOrUnreservedCharacter(XVar6);
        if (!bVar2) {
          value1[1] = L'\0';
          value1[0] = XVar6;
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3ba,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,endIndex_00 * 2 + 2);
  this->fPath = (XMLCh *)CONCAT44(extraout_var,iVar3);
  XMLString::subString
            ((XMLCh *)CONCAT44(extraout_var,iVar3),uriSpec,0,endIndex_00,this->fMemoryManager);
  if (XVar6 == L'?') {
    XVar6 = L'?';
    XVar7 = endIndex_00 + 1;
    for (endIndex_00 = XVar7; endIndex_00 < XVar4; endIndex_00 = endIndex_00 + 1) {
      XVar6 = uriSpec[endIndex_00];
      if (XVar6 == L'%') {
        pXVar1 = uriSpec + endIndex_00;
        if (XVar4 <= endIndex_00 + 2) {
          value1[1] = L'\0';
          memcpy(value1,pXVar1,(ulong)(endIndex_00 + 1 < XVar4) * 2 + 2);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3e3,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,value1
                     ,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269aa7;
        }
        bVar2 = XMLString::isHex(pXVar1[1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[endIndex_00 + 2]), !bVar2)) {
          value1[0] = (XMLCh)*(undefined4 *)pXVar1;
          value1[1] = (XMLCh)((uint)*(undefined4 *)pXVar1 >> 0x10);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3ee,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,value1
                     ,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
      else {
        if (XVar6 == L'#') break;
        bVar2 = isReservedOrUnreservedCharacter(XVar6);
        if (!bVar2) {
          value1[1] = L'\0';
          value1[0] = XVar6;
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3fa,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_QUERY,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
    }
    if (this->fQueryString != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(endIndex_00 - XVar7) * 2 + 2);
    this->fQueryString = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    XMLString::subString
              ((XMLCh *)CONCAT44(extraout_var_00,iVar3),uriSpec,XVar7,endIndex_00,
               this->fMemoryManager);
  }
  if (XVar6 == L'#') {
    startIndex = endIndex_00 + 1;
    for (endIndex = startIndex; endIndex < XVar4; endIndex = endIndex + 1) {
      XVar6 = uriSpec[endIndex];
      if (XVar6 == L'%') {
        pXVar1 = uriSpec + endIndex;
        if (XVar4 <= endIndex + 2) {
          value1[1] = L'\0';
          memcpy(value1,pXVar1,(ulong)(endIndex + 1 < XVar4) * 2 + 2);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x420,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                     value1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
LAB_00269aa7:
          __cxa_throw(pMVar5,&MalformedURLException::typeinfo,XMLException::~XMLException);
        }
        bVar2 = XMLString::isHex(pXVar1[1]);
        if ((!bVar2) || (bVar2 = XMLString::isHex(uriSpec[endIndex + 2]), !bVar2)) {
          value1[0] = (XMLCh)*(undefined4 *)pXVar1;
          value1[1] = (XMLCh)((uint)*(undefined4 *)pXVar1 >> 0x10);
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x42b,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                     value1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
      else {
        bVar2 = isReservedOrUnreservedCharacter(XVar6);
        if (!bVar2) {
          value1[1] = L'\0';
          value1[0] = XVar6;
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x437,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_FRAGMENT,value1,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          goto LAB_00269cde;
        }
      }
    }
    if (this->fFragment != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (startIndex <= endIndex && endIndex - startIndex != 0) {
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(endIndex - startIndex) * 2 + 2);
      this->fFragment = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
      XMLString::subString
                ((XMLCh *)CONCAT44(extraout_var_01,iVar3),uriSpec,startIndex,endIndex,
                 this->fMemoryManager);
      return;
    }
    this->fFragment = (XMLCh *)0x0;
  }
  return;
}

Assistant:

void XMLUri::initializePath(const XMLCh* const uriSpec)
{
    if ( !uriSpec )
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

    XMLSize_t index = 0;
    XMLSize_t start = 0;
    XMLSize_t end = XMLString::stringLen(uriSpec);
    XMLCh testChar = 0;

    // path - everything up to query string or fragment
    if (start < end)
    {
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        if (!getScheme() || uriSpec[start] == chForwardSlash)
        {
            // Scan path.
            // abs_path = "/"  path_segments
            // rel_path = rel_segment [ abs_path ]
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                else if (!isUnreservedCharacter(testChar) &&
                         !isPathCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
        else
        {
            // Scan opaque part.
            // opaque_part = uric_no_slash *uric
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                // If the scheme specific part is opaque, it can contain '['
                // and ']'. uric_no_slash wasn't modified by RFC 2732, which
                // I've interpreted as an error in the spec, since the
                // production should be equivalent to (uric - '/'), and uric
                // contains '[' and ']'.
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
    } //if (start < end)

    if (getPath())
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
    }

    fPath = (XMLCh*) fMemoryManager->allocate((index+1) * sizeof(XMLCh));//new XMLCh[index+1];
    XMLString::subString(fPath, uriSpec, start, index, fMemoryManager);

    // query - starts with ? and up to fragment or end
    if (testChar == chQuestion)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];
            if (testChar == chPound)
            {
                break;
            }

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_QUERY
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
            }
            index++;
        }

        if (getQueryString())
        {
            fMemoryManager->deallocate(fQueryString);//delete [] fQueryString;
        }

        fQueryString = (XMLCh*) fMemoryManager->allocate
        (
            (index - start + 1) * sizeof(XMLCh)
        );//new XMLCh[index - start + 1];
        XMLString::subString(fQueryString, uriSpec, start, index, fMemoryManager);
    }

    // fragment - starts with #
    if (testChar == chPound)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_FRAGMENT
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
            }

            index++;

        }

        if (getFragment())
            fMemoryManager->deallocate(fFragment);//delete [] fFragment;

        //make sure that there is something following the '#'
        if (index > start)
        {
            fFragment = (XMLCh*) fMemoryManager->allocate
            (
                (index - start + 1) * sizeof(XMLCh)
            );//new XMLCh[index - start + 1];
            XMLString::subString(fFragment, uriSpec, start, index, fMemoryManager);
        }
        else
        {
            // RFC 2396, 4.0. URI Reference
            // URI-reference = [absoulteURI | relativeURI] [# fragment]
            //
            // RFC 2396, 4.1. Fragment Identifier
            // fragment = *uric
            //
            // empty fragment is valid
            fFragment = 0;
        }
    }

}